

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

int __thiscall Catch::Session::runInternal(Session *this)

{
  AssertionResult *pAVar1;
  ColourMode CVar2;
  Config *pCVar3;
  undefined8 *puVar4;
  long *plVar5;
  long *plVar6;
  unique_ptr<Catch::MultiReporter> uVar7;
  bool bVar8;
  uint uVar9;
  int iVar10;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar11;
  undefined4 extraout_var;
  undefined8 *puVar12;
  ostream *poVar13;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  undefined4 extraout_var_02;
  char *pcVar15;
  TestCaseInfo **testInfo;
  long *plVar16;
  _Rb_tree_color _Var17;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__x;
  pointer pPVar18;
  unique_ptr<Catch::MultiReporter> multi;
  IEventListenerPtr reporter;
  Totals totals;
  TestGroup tests;
  unique_ptr<Catch::MultiReporter> local_2c8;
  undefined1 local_2c0 [8];
  MultiReporter *local_2b8;
  undefined1 local_2b0 [8];
  undefined1 local_2a8 [8];
  undefined1 local_2a0 [72];
  undefined1 local_258 [32];
  AssertionResult local_238 [3];
  bool local_38;
  
  if (this->m_startupExceptions != false) {
    return 1;
  }
  if ((this->m_configData).showHelp != false) {
    return 0;
  }
  if ((this->m_configData).libIdentify != false) {
    return 0;
  }
  if ((this->m_configData).shardCount <= (this->m_configData).shardIndex) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"The shard count (",0x11);
    poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,") must be greater than the shard index (",0x28);
    poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,")\n",2);
    std::ostream::flush();
    return 1;
  }
  config(this);
  pCVar3 = (this->m_config).m_ptr;
  if (pCVar3 == (Config *)0x0) {
LAB_0014cc3e:
    pcVar15 = "T &Catch::Detail::unique_ptr<Catch::Config>::operator*() [T = Catch::Config]";
LAB_0014cc81:
    __assert_fail("m_ptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.hpp"
                  ,0x37d,pcVar15);
  }
  sharedRng();
  uVar9 = (*(pCVar3->super_IConfig)._vptr_IConfig[0x11])(pCVar3);
  sharedRng::s_rng.m_state = (ulong)uVar9 * 0x5851f42d4c957f2d + 0x6f1903917447ed96;
  if ((this->m_configData).filenamesAsTags == true) {
    pSVar11 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
              ::getInternal();
    iVar10 = (*(pSVar11->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[3])(pSVar11);
    puVar12 = (undefined8 *)
              (**(code **)(*(long *)CONCAT44(extraout_var,iVar10) + 0x10))
                        ((long *)CONCAT44(extraout_var,iVar10));
    puVar4 = (undefined8 *)puVar12[1];
    for (puVar12 = (undefined8 *)*puVar12; puVar12 != puVar4; puVar12 = puVar12 + 1) {
      TestCaseInfo::addFilenameTag((TestCaseInfo *)*puVar12);
    }
  }
  if (Context::currentContext == (long *)0x0) {
    Context::currentContext = (long *)operator_new(0x10);
    *Context::currentContext = 0;
    Context::currentContext[1] = 0;
  }
  pCVar3 = (this->m_config).m_ptr;
  *Context::currentContext = (long)pCVar3;
  pSVar11 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
            ::getInternal();
  iVar10 = (*(pSVar11->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar11);
  plVar5 = *(long **)CONCAT44(extraout_var_00,iVar10);
  if (plVar5 == (long *)0x0) {
LAB_0014cc27:
    pcVar15 = 
    "const T *Catch::Detail::unique_ptr<Catch::ReporterRegistry::ReporterRegistryImpl>::operator->() const [T = Catch::ReporterRegistry::ReporterRegistryImpl]"
    ;
LAB_0014cc1d:
    __assert_fail("m_ptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.hpp"
                  ,0x389,pcVar15);
  }
  if ((*plVar5 == plVar5[1]) &&
     (pPVar18 = (pCVar3->m_processedReporterSpecs).
                super__Vector_base<Catch::ProcessedReporterSpec,_std::allocator<Catch::ProcessedReporterSpec>_>
                ._M_impl.super__Vector_impl_data._M_start,
     (long)(pCVar3->m_processedReporterSpecs).
           super__Vector_base<Catch::ProcessedReporterSpec,_std::allocator<Catch::ProcessedReporterSpec>_>
           ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar18 == 0x78)) {
    makeStream((Catch *)&local_2c8,(string *)&pPVar18->outputFilename);
    CVar2 = pPVar18->colourMode;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_2a8,&(pPVar18->customOptions)._M_t);
    pAVar1 = (AssertionResult *)(local_258 + 0x20);
    local_258._0_8_ = local_2c8.m_ptr;
    local_2c8.m_ptr = (MultiReporter *)0x0;
    if ((_Base_ptr)local_2a0._8_8_ == (_Base_ptr)0x0) {
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_258 + 0x40);
      local_238[0].m_info.macroName.m_start._0_4_ = _S_red;
      local_238[0].m_info.macroName.m_size = 0;
      local_238[0].m_info.lineInfo.file = (char *)pAVar1;
      local_238[0].m_info.lineInfo.line = (size_t)pAVar1;
    }
    else {
      local_238[0].m_info.macroName.m_start._0_4_ = local_2a0._0_4_;
      local_238[0].m_info.macroName.m_size = local_2a0._8_8_;
      local_238[0].m_info.lineInfo.file = (char *)local_2a0._16_8_;
      local_238[0].m_info.lineInfo.line = local_2a0._24_8_;
      *(AssertionResult **)(local_2a0._8_8_ + 8) = pAVar1;
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_2a0 + 0x20);
      local_238[0].m_info.capturedExpression.m_start = (char *)local_2a0._32_8_;
      local_2a0._8_8_ = (_Base_ptr)0x0;
      local_2a0._16_8_ = (AssertionResult *)(local_2a8 + 8);
      local_2a0._24_8_ = (AssertionResult *)(local_2a8 + 8);
    }
    local_258._8_8_ = pCVar3;
    local_258[0x10] = CVar2;
    paVar14->_M_allocated_capacity = 0;
    anon_unknown_26::createReporter((string *)local_2c0,(ReporterConfig *)pPVar18);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)(local_258 + 0x18));
    if ((MultiReporter *)local_258._0_8_ != (MultiReporter *)0x0) {
      (*((IEventListener *)local_258._0_8_)->_vptr_IEventListener[1])();
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_2a8);
  }
  else {
    local_2c8.m_ptr = (MultiReporter *)operator_new(0x40);
    ((local_2c8.m_ptr)->super_IEventListener).m_preferences.shouldRedirectStdOut = false;
    ((local_2c8.m_ptr)->super_IEventListener).m_preferences.shouldReportAllAssertions = false;
    ((local_2c8.m_ptr)->super_IEventListener).m_config = &pCVar3->super_IConfig;
    ((local_2c8.m_ptr)->super_IEventListener)._vptr_IEventListener =
         (_func_int **)&PTR__MultiReporter_00325a70;
    (local_2c8.m_ptr)->m_insertedListeners = 0;
    ((local_2c8.m_ptr)->m_reporterLikes).
    super__Vector_base<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((local_2c8.m_ptr)->m_reporterLikes).
    super__Vector_base<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined8 *)
     ((long)&((local_2c8.m_ptr)->m_reporterLikes).
             super__Vector_base<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
    *(undefined8 *)
     ((long)&((local_2c8.m_ptr)->m_reporterLikes).
             super__Vector_base<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
    pSVar11 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
              ::getInternal();
    iVar10 = (*(pSVar11->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar11);
    plVar5 = *(long **)CONCAT44(extraout_var_01,iVar10);
    if (plVar5 == (long *)0x0) goto LAB_0014cc27;
    plVar16 = (long *)*plVar5;
    plVar5 = (long *)plVar5[1];
    local_2a0._56_8_ = this;
    if (plVar16 != plVar5) {
      do {
        uVar7.m_ptr = local_2c8.m_ptr;
        if (local_2c8.m_ptr == (MultiReporter *)0x0) goto LAB_0014cbd2;
        plVar6 = (long *)*plVar16;
        if (plVar6 == (long *)0x0) {
          pcVar15 = 
          "const T *Catch::Detail::unique_ptr<Catch::EventListenerFactory>::operator->() const [T = Catch::EventListenerFactory]"
          ;
          goto LAB_0014cc1d;
        }
        (**(code **)(*plVar6 + 0x10))((IEventListenerPtr *)local_258,plVar6,pCVar3);
        MultiReporter::addListener(uVar7.m_ptr,(IEventListenerPtr *)local_258);
        if ((MultiReporter *)local_258._0_8_ != (MultiReporter *)0x0) {
          (*((IEventListener *)local_258._0_8_)->_vptr_IEventListener[1])();
        }
        plVar16 = plVar16 + 1;
      } while (plVar16 != plVar5);
    }
    pPVar18 = (pCVar3->m_processedReporterSpecs).
              super__Vector_base<Catch::ProcessedReporterSpec,_std::allocator<Catch::ProcessedReporterSpec>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_2a0._64_8_ =
         (pCVar3->m_processedReporterSpecs).
         super__Vector_base<Catch::ProcessedReporterSpec,_std::allocator<Catch::ProcessedReporterSpec>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (pPVar18 != (pointer)local_2a0._64_8_) {
      __x = &pPVar18->customOptions;
      do {
        uVar7.m_ptr = local_2c8.m_ptr;
        if (local_2c8.m_ptr == (MultiReporter *)0x0) goto LAB_0014cbd2;
        makeStream((Catch *)&local_2b8,(string *)((long)(__x + -1) + 8));
        CVar2 = *(ColourMode *)((long)(__x + -1) + 0x28);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_2a8,&__x->_M_t);
        local_258._0_8_ = local_2b8;
        local_2b8 = (MultiReporter *)0x0;
        if ((_Base_ptr)local_2a0._8_8_ == (_Base_ptr)0x0) {
          local_238[0].m_info.macroName.m_start._0_4_ = _S_red;
          local_238[0].m_info.macroName.m_size = 0;
          local_238[0].m_info.lineInfo.file = local_258 + 0x20;
          paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_258 + 0x40);
          local_238[0].m_info.lineInfo.line = (size_t)local_238[0].m_info.lineInfo.file;
        }
        else {
          local_238[0].m_info.macroName.m_start._0_4_ = local_2a0._0_4_;
          local_238[0].m_info.macroName.m_size = local_2a0._8_8_;
          local_238[0].m_info.lineInfo.file = (char *)local_2a0._16_8_;
          local_238[0].m_info.lineInfo.line = local_2a0._24_8_;
          *(_Base_ptr *)(local_2a0._8_8_ + 8) = (_Base_ptr)(local_258 + 0x20);
          local_238[0].m_info.capturedExpression.m_start = (char *)local_2a0._32_8_;
          local_2a0._8_8_ = (_Base_ptr)0x0;
          local_2a0._16_8_ = local_2a8 + 8;
          paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_2a0 + 0x20);
          local_2a0._24_8_ = local_2a0._16_8_;
        }
        local_258._8_8_ = pCVar3;
        local_258[0x10] = CVar2;
        paVar14->_M_allocated_capacity = 0;
        anon_unknown_26::createReporter
                  ((string *)local_2b0,(ReporterConfig *)((long)(__x + -2) + 0x18));
        MultiReporter::addReporter(uVar7.m_ptr,(IEventListenerPtr *)local_2b0);
        if (local_2b0 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_2b0 + 8))();
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)(local_258 + 0x18));
        if ((MultiReporter *)local_258._0_8_ != (MultiReporter *)0x0) {
          (*((IEventListener *)local_258._0_8_)->_vptr_IEventListener[1])();
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_2a8);
        pPVar18 = (pointer)(__x + 1);
        __x = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)((long)(__x + 2) + 0x18);
      } while (pPVar18 != (pointer)local_2a0._64_8_);
    }
    local_2c0 = (undefined1  [8])local_2c8.m_ptr;
    local_2c8.m_ptr = (MultiReporter *)0x0;
    Detail::unique_ptr<Catch::MultiReporter>::~unique_ptr(&local_2c8);
    this = (Session *)local_2a0._56_8_;
  }
  pCVar3 = (this->m_config).m_ptr;
  if (pCVar3 == (Config *)0x0) {
LAB_0014cc55:
    pcVar15 = "T *Catch::Detail::unique_ptr<Catch::Config>::operator->() [T = Catch::Config]";
LAB_0014cbfe:
    __assert_fail("m_ptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.hpp"
                  ,0x385,pcVar15);
  }
  iVar10 = (*(pCVar3->super_IConfig)._vptr_IConfig[0xd])();
  puVar12 = *(undefined8 **)(CONCAT44(extraout_var_02,iVar10) + 0x18);
  puVar4 = *(undefined8 **)(CONCAT44(extraout_var_02,iVar10) + 0x20);
  if (puVar12 != puVar4) {
    do {
      if (local_2c0 == (undefined1  [8])0x0) {
        pcVar15 = 
        "T *Catch::Detail::unique_ptr<Catch::IEventListener>::operator->() [T = Catch::IEventListener]"
        ;
        goto LAB_0014cbfe;
      }
      (**(code **)(*(long *)local_2c0 + 0x18))(local_2c0,*puVar12,puVar12[1]);
      puVar12 = puVar12 + 4;
    } while (puVar12 != puVar4);
    _Var17 = _S_black;
    goto LAB_0014cb48;
  }
  if (local_2c0 == (undefined1  [8])0x0) {
    pcVar15 = 
    "T &Catch::Detail::unique_ptr<Catch::IEventListener>::operator*() [T = Catch::IEventListener]";
    goto LAB_0014cc81;
  }
  pCVar3 = (this->m_config).m_ptr;
  if (pCVar3 == (Config *)0x0) goto LAB_0014cc3e;
  bVar8 = list((IEventListener *)local_2c0,pCVar3);
  _Var17 = _S_red;
  if (bVar8) goto LAB_0014cb48;
  anon_unknown_26::TestGroup::TestGroup
            ((TestGroup *)local_258,(IEventListenerPtr *)local_2c0,(this->m_config).m_ptr);
  anon_unknown_26::TestGroup::execute((Totals *)local_2a8,(TestGroup *)local_258);
  if (local_38 == true) {
    pCVar3 = (this->m_config).m_ptr;
    if (pCVar3 == (Config *)0x0) goto LAB_0014cc55;
    iVar10 = (*(pCVar3->super_IConfig)._vptr_IConfig[7])();
    _Var17 = 3;
    if ((char)iVar10 == '\0') goto LAB_0014cac1;
  }
  else {
LAB_0014cac1:
    if ((undefined1 *)
        ((long)&(((AssertionInfo *)local_2a0._24_8_)->macroName).m_start +
        local_2a0._32_8_ + local_2a0._48_8_ + local_2a0._40_8_) == (undefined1 *)0x0) {
      pCVar3 = (this->m_config).m_ptr;
      if (pCVar3 == (Config *)0x0) goto LAB_0014cc55;
      iVar10 = (*(pCVar3->super_IConfig)._vptr_IConfig[8])();
      _Var17 = 2;
      if ((char)iVar10 == '\0') goto LAB_0014cb3e;
    }
    if (((undefined1 *)
         ((long)&(((AssertionInfo *)local_2a0._24_8_)->macroName).m_start +
         local_2a0._32_8_ + local_2a0._40_8_) == (undefined1 *)0x0) && (local_2a0._48_8_ != 0)) {
      pCVar3 = (this->m_config).m_ptr;
      if (pCVar3 == (Config *)0x0) goto LAB_0014cc55;
      iVar10 = (*(pCVar3->super_IConfig)._vptr_IConfig[8])();
      _Var17 = 4;
      if ((char)iVar10 == '\0') goto LAB_0014cb3e;
    }
    _Var17 = 0xff;
    if ((int)local_2a0._0_4_ < 0xff) {
      _Var17 = local_2a0._0_4_;
    }
  }
LAB_0014cb3e:
  anon_unknown_26::TestGroup::~TestGroup((TestGroup *)local_258);
LAB_0014cb48:
  if (local_2c0 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_2c0 + 8))();
  }
  return _Var17;
LAB_0014cbd2:
  pcVar15 = 
  "T *Catch::Detail::unique_ptr<Catch::MultiReporter>::operator->() [T = Catch::MultiReporter]";
  goto LAB_0014cbfe;
}

Assistant:

int Session::runInternal() {
        if( m_startupExceptions )
            return 1;

        if (m_configData.showHelp || m_configData.libIdentify) {
            return 0;
        }

        if ( m_configData.shardIndex >= m_configData.shardCount ) {
            Catch::cerr() << "The shard count (" << m_configData.shardCount
                          << ") must be greater than the shard index ("
                          << m_configData.shardIndex << ")\n"
                          << std::flush;
            return 1;
        }

        CATCH_TRY {
            config(); // Force config to be constructed

            seedRng( *m_config );

            if (m_configData.filenamesAsTags) {
                applyFilenamesAsTags();
            }

            // Set up global config instance before we start calling into other functions
            getCurrentMutableContext().setConfig(m_config.get());

            // Create reporter(s) so we can route listings through them
            auto reporter = prepareReporters(m_config.get());

            auto const& invalidSpecs = m_config->testSpec().getInvalidSpecs();
            if ( !invalidSpecs.empty() ) {
                for ( auto const& spec : invalidSpecs ) {
                    reporter->reportInvalidTestSpec( spec );
                }
                return 1;
            }


            // Handle list request
            if (list(*reporter, *m_config)) {
                return 0;
            }

            TestGroup tests { CATCH_MOVE(reporter), m_config.get() };
            auto const totals = tests.execute();

            if ( tests.hadUnmatchedTestSpecs()
                && m_config->warnAboutUnmatchedTestSpecs() ) {
                return 3;
            }

            if ( totals.testCases.total() == 0
                && !m_config->zeroTestsCountAsSuccess() ) {
                return 2;
            }

            if ( totals.testCases.total() > 0 &&
                 totals.testCases.total() == totals.testCases.skipped
                && !m_config->zeroTestsCountAsSuccess() ) {
                return 4;
            }

            // Note that on unices only the lower 8 bits are usually used, clamping
            // the return value to 255 prevents false negative when some multiple
            // of 256 tests has failed
            return (std::min) (MaxExitCode, static_cast<int>(totals.assertions.failed));
        }